

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O2

string * __thiscall Kuhn::Game::infoSetStr_abi_cxx11_(string *__return_storage_ptr__,Game *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = this->mCurrentPlayer;
  iVar2 = this->mTurnNum;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,this->mInfoSets + iVar1,
             this->mInfoSets[iVar1] + (long)iVar2 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string Game::infoSetStr() const {
    return std::string((char *) mInfoSets[mCurrentPlayer], mTurnNum + 1);
}